

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  byte *pbVar1;
  byte bVar2;
  uint32_t value;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  pbVar3 = (byte *)(size + (long)start);
  if (start < pbVar3) {
    pbVar4 = (byte *)start;
    do {
      if (prefix != (char *)0x0) {
        Writef(this,"%s",prefix);
      }
      Writef(this,"%07zx: ",pbVar4 + (offset - (long)start));
      pbVar5 = pbVar4;
      if (pbVar4 < pbVar4 + 0x10) {
        pbVar1 = pbVar4;
        iVar6 = 0;
        do {
          do {
            pbVar5 = pbVar1;
            if (pbVar5 < pbVar3) {
              Writef(this,"%02x",(ulong)*pbVar5);
            }
            else {
              local_32 = 0x20;
              WriteData(this,&local_32,1,(char *)0x0,No);
              local_33 = 0x20;
              WriteData(this,&local_33,1,(char *)0x0,No);
            }
            pbVar1 = pbVar5 + 1;
            bVar8 = iVar6 == 0;
            iVar6 = iVar6 + 1;
          } while (bVar8);
          local_31 = 0x20;
          iVar6 = 0;
          WriteData(this,&local_31,1,(char *)0x0,No);
        } while (pbVar1 < pbVar4 + 0x10);
        pbVar5 = pbVar5 + 1;
      }
      if (print_chars == Yes) {
        local_34 = 0x20;
        WriteData(this,&local_34,1,(char *)0x0,No);
        pbVar5 = pbVar4;
        if (pbVar4 < pbVar3) {
          uVar7 = 0;
          do {
            bVar2 = *pbVar5;
            iVar6 = isprint((uint)bVar2);
            value = (int)(char)bVar2;
            if (iVar6 == 0) {
              value = 0x2e;
            }
            WriteU8(this,value,(char *)0x0,No);
            pbVar5 = pbVar5 + 1;
          } while ((uVar7 < 0xf) && (uVar7 = uVar7 + 1, pbVar5 < pbVar3));
        }
      }
      if ((desc != (char *)0x0) && (pbVar3 <= pbVar5)) {
        Writef(this,"  ; %s",desc);
      }
      local_35 = 10;
      WriteData(this,&local_35,1,(char *)0x0,No);
      pbVar4 = pbVar5;
    } while (pbVar5 < pbVar3);
  }
  return;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}